

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_truetype.h
# Opt level: O1

void stbtt_Rasterize(stbtt__bitmap *result,float flatness_in_pixels,stbtt_vertex *vertices,
                    int num_verts,float scale_x,float scale_y,float shift_x,float shift_y,int x_off,
                    int y_off,int invert,void *userdata)

{
  short sVar1;
  short sVar2;
  float *__s;
  stbtt__active_edge *z;
  void *__ptr;
  stbtt__point *points;
  ulong uVar3;
  stbtt__edge *p_00;
  float *scanline;
  ulong uVar4;
  stbtt__active_edge *psVar5;
  undefined8 *puVar6;
  uchar uVar7;
  long lVar8;
  stbtt__active_edge *psVar9;
  stbtt__active_edge *psVar10;
  undefined8 *puVar11;
  ulong uVar12;
  uint uVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  size_t __size;
  undefined4 in_register_00000084;
  int iVar17;
  int iVar18;
  stbtt__edge *psVar19;
  int iVar20;
  stbtt__bitmap *psVar21;
  uint uVar22;
  void *p;
  bool bVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float bx0;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float y0;
  stbtt__active_edge *active;
  int num_points;
  int local_2fc;
  float local_2f8;
  stbtt__active_edge *local_2e8;
  undefined1 local_2d0 [12];
  undefined1 auStack_2c4 [12];
  undefined1 local_2b8 [16];
  undefined8 *local_2a8;
  void *local_2a0;
  float *local_298;
  int local_290;
  float local_28c;
  undefined1 local_288 [16];
  ulong local_270;
  stbtt__bitmap *local_268;
  float *local_260;
  undefined1 local_258 [16];
  stbtt__edge *local_248;
  ulong local_240;
  undefined8 local_238;
  int local_230;
  
  local_270 = CONCAT44(in_register_00000084,y_off);
  local_288._0_4_ = x_off;
  local_258._0_4_ = shift_y;
  local_2b8._0_4_ = shift_x;
  local_238 = local_238 & 0xffffffff00000000;
  if (num_verts < 1) {
    uVar13 = 0;
  }
  else {
    lVar8 = 0;
    uVar13 = 0;
    do {
      uVar13 = uVar13 + ((&vertices->type)[lVar8] == '\x01');
      lVar8 = lVar8 + 0xe;
    } while ((ulong)(uint)num_verts * 0xe != lVar8);
  }
  points = (stbtt__point *)0x0;
  local_268 = result;
  local_2d0._8_4_ = flatness_in_pixels;
  if (uVar13 == 0) {
    __ptr = (void *)0x0;
  }
  else {
    __ptr = malloc((long)(int)uVar13 << 2);
    if (__ptr == (void *)0x0) {
LAB_0016aacb:
      uVar13 = 0;
      points = (stbtt__point *)0x0;
    }
    else {
      fVar25 = scale_y;
      if (scale_x <= scale_y) {
        fVar25 = scale_x;
      }
      local_2d0._8_4_ = ((float)local_2d0._8_4_ / fVar25) * ((float)local_2d0._8_4_ / fVar25);
      fVar25 = 0.0;
      points = (stbtt__point *)0x0;
      local_2a0 = __ptr;
      iVar16 = 0;
      do {
        if (iVar16 == 0) {
LAB_0016a8a3:
          local_238 = local_238 & 0xffffffff00000000;
          if (num_verts < 1) {
            lVar8 = -1;
          }
          else {
            uVar22 = 0xffffffff;
            fVar26 = 0.0;
            lVar8 = 0;
            fVar24 = 0.0;
            do {
              uVar4 = local_238;
              switch((&vertices->type)[lVar8]) {
              case '\x01':
                if (-1 < (int)uVar22) {
                  *(int *)((long)local_2a0 + (ulong)uVar22 * 4) =
                       (int)(float)local_238 - (int)fVar25;
                }
                uVar22 = uVar22 + 1;
                sVar1 = *(short *)((long)&vertices->x + lVar8);
                sVar2 = *(short *)((long)&vertices->y + lVar8);
                fVar25 = (float)local_238;
                break;
              case '\x02':
                sVar1 = *(short *)((long)&vertices->x + lVar8);
                sVar2 = *(short *)((long)&vertices->y + lVar8);
                break;
              case '\x03':
                stbtt__tesselate_curve
                          (points,(int *)&local_238,fVar24,fVar26,
                           (float)(int)*(short *)((long)&vertices->cx + lVar8),
                           (float)(int)*(short *)((long)&vertices->cy + lVar8),
                           (float)(int)*(short *)((long)&vertices->x + lVar8),
                           (float)(int)*(short *)((long)&vertices->y + lVar8),(float)local_2d0._8_4_
                           ,0);
                goto LAB_0016aa02;
              case '\x04':
                stbtt__tesselate_cubic
                          (points,(int *)&local_238,fVar24,fVar26,
                           (float)(int)*(short *)((long)&vertices->cx + lVar8),
                           (float)(int)*(short *)((long)&vertices->cy + lVar8),
                           (float)(int)*(short *)((long)&vertices->cx1 + lVar8),
                           (float)(int)*(short *)((long)&vertices->cy1 + lVar8),
                           (float)(int)*(short *)((long)&vertices->x + lVar8),
                           (float)(int)*(short *)((long)&vertices->y + lVar8),(float)local_2d0._8_4_
                           ,0);
LAB_0016aa02:
                fVar24 = (float)(int)*(short *)((long)&vertices->x + lVar8);
                fVar26 = (float)(int)*(short *)((long)&vertices->y + lVar8);
                uVar4 = local_238;
              default:
                goto switchD_0016a8f0_default;
              }
              uVar4 = CONCAT44(local_238._4_4_,(int)(float)local_238 + 1);
              fVar26 = (float)(int)sVar2;
              fVar24 = (float)(int)sVar1;
              if (points != (stbtt__point *)0x0) {
                points[(int)(float)local_238].x = fVar24;
                points[(int)(float)local_238].y = fVar26;
              }
switchD_0016a8f0_default:
              local_238 = uVar4;
              lVar8 = lVar8 + 0xe;
            } while ((ulong)(uint)num_verts * 0xe != lVar8);
            lVar8 = (long)(int)uVar22;
            __ptr = local_2a0;
          }
          *(int *)((long)__ptr + lVar8 * 4) = (int)(float)local_238 - (int)fVar25;
          bVar23 = true;
        }
        else {
          points = (stbtt__point *)malloc((long)(int)(float)local_238 << 3);
          if (points != (stbtt__point *)0x0) goto LAB_0016a8a3;
          points = (stbtt__point *)0x0;
          bVar23 = false;
        }
        if (!bVar23) {
          free(points);
          free(__ptr);
          __ptr = (void *)0x0;
          goto LAB_0016aacb;
        }
        bVar23 = iVar16 == 0;
        iVar16 = iVar16 + 1;
      } while (bVar23);
    }
  }
  uVar4 = local_270;
  if (points != (stbtt__point *)0x0) {
    local_2f8 = scale_y;
    if (invert != 0) {
      local_2f8 = -scale_y;
    }
    if ((int)uVar13 < 1) {
      __size = 0x14;
    }
    else {
      uVar3 = 0;
      lVar8 = 0;
      do {
        lVar8 = (long)(int)lVar8 + (long)*(int *)((long)__ptr + uVar3 * 4);
        uVar3 = uVar3 + 1;
      } while (uVar13 != uVar3);
      __size = lVar8 * 0x14 + 0x14;
    }
    p_00 = (stbtt__edge *)malloc(__size);
    if (p_00 != (stbtt__edge *)0x0) {
      if ((int)uVar13 < 1) {
        uVar22 = 0;
      }
      else {
        uVar3 = 0;
        uVar22 = 0;
        iVar16 = 0;
        do {
          iVar20 = *(int *)((long)__ptr + uVar3 * 4);
          if (0 < (long)iVar20) {
            lVar8 = 0;
            iVar15 = iVar20 + -1;
            do {
              fVar25 = points[(long)iVar16 + (long)iVar15].y;
              fVar24 = points[iVar16 + lVar8].y;
              iVar17 = (int)lVar8;
              if ((fVar25 != fVar24) || (NAN(fVar25) || NAN(fVar24))) {
                psVar19 = p_00 + (int)uVar22;
                p_00[(int)uVar22].invert = 0;
                iVar18 = iVar15;
                iVar14 = iVar17;
                if (invert == 0) {
                  if (fVar25 < fVar24) goto LAB_0016abd0;
                }
                else if (fVar24 < fVar25) {
LAB_0016abd0:
                  psVar19->invert = 1;
                  iVar18 = iVar17;
                  iVar14 = iVar15;
                }
                psVar19->x0 = points[(long)iVar16 + (long)iVar14].x * scale_x +
                              (float)local_2b8._0_4_;
                psVar19->y0 = points[(long)iVar16 + (long)iVar14].y * local_2f8 +
                              (float)local_258._0_4_;
                psVar19->x1 = points[(long)iVar16 + (long)iVar18].x * scale_x +
                              (float)local_2b8._0_4_;
                psVar19->y1 = points[(long)iVar16 + (long)iVar18].y * local_2f8 +
                              (float)local_258._0_4_;
                uVar22 = uVar22 + 1;
              }
              lVar8 = lVar8 + 1;
              iVar15 = iVar17;
            } while (iVar20 != lVar8);
          }
          iVar16 = iVar20 + iVar16;
          uVar3 = uVar3 + 1;
        } while (uVar3 != uVar13);
      }
      stbtt__sort_edges_quicksort(p_00,uVar22);
      psVar21 = local_268;
      if (1 < (int)uVar22) {
        uVar3 = 1;
        do {
          fVar25 = p_00[uVar3].x0;
          fVar24 = p_00[uVar3].y0;
          local_230 = p_00[uVar3].invert;
          local_238._0_4_ = p_00[uVar3].x1;
          local_238._4_4_ = p_00[uVar3].y1;
          uVar12 = uVar3 & 0xffffffff;
          do {
            uVar13 = (uint)uVar12;
            if ((int)uVar13 < 1) break;
            fVar26 = p_00[uVar12 - 1].y0;
            if (fVar24 < fVar26) {
              psVar19 = p_00 + uVar12;
              psVar19->invert = psVar19[-1].invert;
              fVar27 = psVar19[-1].y0;
              fVar29 = psVar19[-1].x1;
              fVar31 = psVar19[-1].y1;
              psVar19->x0 = psVar19[-1].x0;
              psVar19->y0 = fVar27;
              psVar19->x1 = fVar29;
              psVar19->y1 = fVar31;
              uVar12 = (ulong)(uVar13 - 1);
            }
            uVar13 = (uint)uVar12;
          } while (fVar24 < fVar26);
          if (uVar3 != uVar13) {
            p_00[(int)uVar13].x0 = fVar25;
            p_00[(int)uVar13].y0 = fVar24;
            p_00[(int)uVar13].x1 = (float)local_238;
            p_00[(int)uVar13].y1 = (float)local_238._4_4_;
            p_00[(int)uVar13].invert = local_230;
          }
          uVar3 = uVar3 + 1;
        } while (uVar3 != uVar22);
      }
      local_2d0._0_8_ = (stbtt__active_edge *)0x0;
      uVar13 = local_268->w;
      local_2a0 = __ptr;
      if ((int)uVar13 < 0x41) {
        scanline = (float *)&local_238;
      }
      else {
        scanline = (float *)malloc((ulong)uVar13 * 8 + 4);
      }
      iVar16 = psVar21->h;
      p_00[(int)uVar22].y0 = (float)(iVar16 + (int)uVar4) + 1.0;
      uVar3 = 0;
      if (iVar16 < 1) {
        local_2a8 = (undefined8 *)0x0;
        puVar11 = local_2a8;
        psVar19 = p_00;
      }
      else {
        local_298 = scanline + (int)uVar13;
        local_28c = (float)(int)local_288._0_4_;
        local_260 = local_298 + 1;
        uVar4 = uVar4 & 0xffffffff;
        local_2a8 = (undefined8 *)0x0;
        local_2fc = 0;
        local_2e8 = (stbtt__active_edge *)0x0;
        local_248 = p_00;
        do {
          __s = local_298;
          local_290 = (int)uVar4;
          fVar25 = (float)local_290;
          fVar24 = fVar25 + 1.0;
          iVar16 = psVar21->w;
          memset(scanline,0,(long)iVar16 * 4);
          memset(__s,0,(long)iVar16 * 4 + 4);
          if ((stbtt__active_edge *)local_2d0._0_8_ != (stbtt__active_edge *)0x0) {
            psVar5 = (stbtt__active_edge *)local_2d0._0_8_;
            psVar9 = (stbtt__active_edge *)local_2d0;
            do {
              psVar10 = psVar5;
              if (psVar5->ey <= fVar25) {
                psVar9->next = psVar5->next;
                if ((psVar5->direction == 0.0) && (!NAN(psVar5->direction))) {
                  __assert_fail("z->direction",
                                "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/stb/stb_truetype.h"
                                ,0xd03,
                                "void stbtt__rasterize_sorted_edges(stbtt__bitmap *, stbtt__edge *, int, int, int, int, void *)"
                               );
                }
                psVar5->direction = 0.0;
                psVar5->next = local_2e8;
                psVar10 = psVar9;
                local_2e8 = psVar5;
              }
              psVar5 = psVar10->next;
              psVar9 = psVar10;
            } while (psVar5 != (stbtt__active_edge *)0x0);
          }
          fVar26 = p_00->y0;
          local_240 = uVar3;
          puVar11 = local_2a8;
          if (fVar26 <= fVar24) {
            bVar23 = (int)local_270 != 0;
            do {
              fVar27 = p_00->y1;
              if ((fVar26 != fVar27) || (NAN(fVar26) || NAN(fVar27))) {
                if (local_2e8 == (stbtt__active_edge *)0x0) {
                  if (local_2fc == 0) {
                    puVar6 = (undefined8 *)malloc(0x6408);
                    if (puVar6 == (undefined8 *)0x0) {
                      psVar5 = (stbtt__active_edge *)0x0;
                      goto LAB_0016b6b9;
                    }
                    *puVar6 = puVar11;
                    local_2fc = 800;
                    puVar11 = puVar6;
                  }
                  lVar8 = (long)local_2fc;
                  local_2fc = local_2fc + -1;
                  psVar5 = (stbtt__active_edge *)(puVar11 + lVar8 * 4 + -3);
                }
                else {
                  psVar5 = local_2e8;
                  local_2e8 = local_2e8->next;
                }
LAB_0016b6b9:
                if (psVar5 == (stbtt__active_edge *)0x0) {
                  __assert_fail("z != ((void*)0)",
                                "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/stb/stb_truetype.h"
                                ,0xb2d,
                                "stbtt__active_edge *stbtt__new_active(stbtt__hheap *, stbtt__edge *, int, float, void *)"
                               );
                }
                fVar29 = p_00->x0;
                fVar31 = (p_00->x1 - fVar29) / (fVar27 - fVar26);
                psVar5->fdx = fVar31;
                psVar5->fdy = (float)(-(uint)(fVar31 != 0.0) & (uint)(1.0 / fVar31));
                psVar5->fx = ((fVar25 - fVar26) * fVar31 + fVar29) - local_28c;
                psVar5->direction = *(float *)(&DAT_00212af0 + (ulong)(p_00->invert == 0) * 4);
                psVar5->sy = fVar26;
                psVar5->ey = fVar27;
                psVar5->next = (stbtt__active_edge *)0x0;
                if (fVar27 < fVar25 && ((int)uVar3 == 0 && bVar23)) {
                  psVar5->ey = fVar25;
                }
                if (psVar5->ey < fVar25) {
                  __assert_fail("z->ey >= scan_y_top",
                                "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/stb/stb_truetype.h"
                                ,0xd16,
                                "void stbtt__rasterize_sorted_edges(stbtt__bitmap *, stbtt__edge *, int, int, int, int, void *)"
                               );
                }
                psVar5->next = (stbtt__active_edge *)local_2d0._0_8_;
                local_2d0._0_8_ = psVar5;
              }
              fVar26 = p_00[1].y0;
              p_00 = p_00 + 1;
            } while (fVar26 <= fVar24);
          }
          local_2a8 = puVar11;
          if ((stbtt__active_edge *)local_2d0._0_8_ != (stbtt__active_edge *)0x0) {
            fVar26 = (float)iVar16;
            psVar5 = (stbtt__active_edge *)local_2d0._0_8_;
            do {
              fVar27 = psVar5->ey;
              if (fVar27 < fVar25) {
                __assert_fail("e->ey >= y_top",
                              "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/stb/stb_truetype.h"
                              ,0xc12,
                              "void stbtt__fill_active_edges_new(float *, float *, int, stbtt__active_edge *, float)"
                             );
              }
              fVar29 = psVar5->fx;
              fVar31 = psVar5->fdx;
              if ((fVar31 != 0.0) || (NAN(fVar31))) {
                fVar35 = psVar5->sy;
                if (fVar24 < fVar35) {
                  __assert_fail("e->sy <= y_bottom && e->ey >= y_top",
                                "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/stb/stb_truetype.h"
                                ,0xc25,
                                "void stbtt__fill_active_edges_new(float *, float *, int, stbtt__active_edge *, float)"
                               );
                }
                fVar33 = fVar31 + fVar29;
                fVar30 = (float)(~-(uint)(fVar25 < fVar35) & (uint)fVar29 |
                                (uint)((fVar35 - fVar25) * fVar31 + fVar29) &
                                -(uint)(fVar25 < fVar35));
                if ((((fVar30 < 0.0) ||
                     (fVar32 = (float)(~-(uint)(fVar27 < fVar24) & (uint)fVar33 |
                                      (uint)((fVar27 - fVar25) * fVar31 + fVar29) &
                                      -(uint)(fVar27 < fVar24)), fVar32 < 0.0)) ||
                    (fVar26 <= fVar30)) || (fVar26 <= fVar32)) {
                  if (0 < iVar16) {
                    local_258 = ZEXT416((uint)fVar31);
                    auStack_2c4 = (undefined1  [12])0x0;
                    local_288 = ZEXT416((uint)fVar29);
                    local_2d0._8_4_ = fVar33;
                    iVar20 = 0;
                    do {
                      fVar35 = (float)iVar20;
                      iVar15 = iVar20 + 1;
                      fVar30 = (float)iVar15;
                      fVar27 = (fVar35 - fVar29) / fVar31 + fVar25;
                      fVar31 = (fVar30 - fVar29) / fVar31 + fVar25;
                      if ((fVar35 <= fVar29) || ((float)local_2d0._8_4_ <= fVar30)) {
                        if ((fVar35 <= (float)local_2d0._8_4_) || (fVar29 <= fVar30)) {
                          fVar33 = fVar25;
                          if (((fVar35 <= fVar29) || ((float)local_2d0._8_4_ <= fVar35)) &&
                             ((fVar35 <= (float)local_2d0._8_4_ || (fVar29 <= fVar35)))) {
                            fVar27 = fVar25;
                            if (((fVar29 < fVar30) && (fVar30 < (float)local_2d0._8_4_)) ||
                               ((fVar35 = fVar29, (float)local_2d0._8_4_ < fVar30 &&
                                (fVar30 < fVar29)))) {
                              local_2b8._0_4_ = fVar31;
                              goto LAB_0016b150;
                            }
                            goto LAB_0016b217;
                          }
                        }
                        else {
                          local_2b8._0_4_ = fVar31;
                          stbtt__handle_clipped_edge
                                    (scanline,iVar20,psVar5,fVar29,fVar25,fVar30,fVar31);
                          fVar29 = fVar30;
                          fVar33 = (float)local_2b8._0_4_;
                        }
                        stbtt__handle_clipped_edge
                                  (scanline,iVar20,psVar5,fVar29,fVar33,fVar35,fVar27);
                      }
                      else {
                        local_2b8._0_4_ = fVar31;
                        stbtt__handle_clipped_edge
                                  (scanline,iVar20,psVar5,fVar29,fVar25,fVar35,fVar27);
                        fVar29 = fVar35;
                        fVar31 = (float)local_2b8._0_4_;
LAB_0016b150:
                        stbtt__handle_clipped_edge
                                  (scanline,iVar20,psVar5,fVar29,fVar27,fVar30,fVar31);
                        fVar35 = fVar30;
                        fVar27 = (float)local_2b8._0_4_;
                      }
LAB_0016b217:
                      stbtt__handle_clipped_edge
                                (scanline,iVar20,psVar5,fVar35,fVar27,(float)local_2d0._8_4_,fVar24)
                      ;
                      fVar29 = (float)local_288._0_4_;
                      fVar31 = (float)local_258._0_4_;
                      iVar20 = iVar15;
                    } while (iVar16 != iVar15);
                  }
                }
                else {
                  if (fVar35 <= fVar25) {
                    fVar35 = fVar25;
                  }
                  uVar13 = (uint)fVar30;
                  uVar4 = (ulong)uVar13;
                  if (fVar24 <= fVar27) {
                    fVar27 = fVar24;
                  }
                  if (uVar13 == (int)fVar32) {
                    if (((int)uVar13 < 0) || (iVar16 <= (int)uVar13)) {
                      __assert_fail("x >= 0 && x < len",
                                    "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/stb/stb_truetype.h"
                                    ,0xc41,
                                    "void stbtt__fill_active_edges_new(float *, float *, int, stbtt__active_edge *, float)"
                                   );
                    }
                    fVar34 = (fVar27 - fVar35) * psVar5->direction;
                    fVar27 = stbtt__position_trapezoid_area
                                       (fVar34,fVar30,(float)(int)uVar13 + 1.0,fVar32,
                                        (float)(int)uVar13 + 1.0);
                    scanline[uVar4] = fVar27 + scanline[uVar4];
                  }
                  else {
                    fVar28 = psVar5->fdy;
                    bx0 = fVar32;
                    if (fVar32 < fVar30) {
                      fVar34 = fVar25 - fVar35;
                      fVar35 = (fVar25 - fVar27) + fVar24;
                      fVar31 = -fVar31;
                      fVar28 = -fVar28;
                      bx0 = fVar30;
                      fVar29 = fVar33;
                      fVar27 = fVar34 + fVar24;
                      fVar30 = fVar32;
                    }
                    if (fVar28 < 0.0) {
                      __assert_fail("dy >= 0",
                                    "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/stb/stb_truetype.h"
                                    ,0xc53,
                                    "void stbtt__fill_active_edges_new(float *, float *, int, stbtt__active_edge *, float)"
                                   );
                    }
                    if (fVar31 < 0.0) {
                      __assert_fail("dx >= 0",
                                    "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/stb/stb_truetype.h"
                                    ,0xc54,
                                    "void stbtt__fill_active_edges_new(float *, float *, int, stbtt__active_edge *, float)"
                                   );
                    }
                    iVar15 = (int)bx0;
                    iVar20 = (int)fVar30 + 1;
                    fVar32 = ((float)iVar20 - fVar29) * fVar28 + fVar25;
                    fVar33 = (float)(int)bx0;
                    fVar31 = fVar24;
                    if (fVar32 <= fVar24) {
                      fVar31 = fVar32;
                    }
                    fVar34 = psVar5->direction;
                    fVar32 = (fVar31 - fVar35) * fVar34;
                    lVar8 = (long)(int)fVar30;
                    fVar29 = (fVar33 - fVar29) * fVar28 + fVar25;
                    scanline[lVar8] = ((float)iVar20 - fVar30) * fVar32 * 0.5 + scanline[lVar8];
                    if (iVar15 - iVar20 != 0 && iVar20 <= iVar15) {
                      fVar31 = (float)(~-(uint)(fVar24 < fVar29) & (uint)fVar28 |
                                      (uint)((fVar24 - fVar31) / (float)(iVar15 - iVar20)) &
                                      -(uint)(fVar24 < fVar29)) * fVar34;
                      do {
                        scanline[lVar8 + 1] = fVar31 * 0.5 + fVar32 + scanline[lVar8 + 1];
                        fVar32 = fVar32 + fVar31;
                        lVar8 = lVar8 + 1;
                      } while (iVar15 + -1 != (int)lVar8);
                    }
                    if (1.01 < ABS(fVar32)) {
                      __assert_fail("fabs(area) <= 1.01f",
                                    "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/stb/stb_truetype.h"
                                    ,0xc94,
                                    "void stbtt__fill_active_edges_new(float *, float *, int, stbtt__active_edge *, float)"
                                   );
                    }
                    local_2b8 = ZEXT416((uint)fVar32);
                    fVar31 = fVar24;
                    if (fVar29 <= fVar24) {
                      fVar31 = fVar29;
                    }
                    if (fVar27 <= fVar31 + -0.01) {
                      __assert_fail("sy1 > y_final-0.01f",
                                    "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/stb/stb_truetype.h"
                                    ,0xc95,
                                    "void stbtt__fill_active_edges_new(float *, float *, int, stbtt__active_edge *, float)"
                                   );
                    }
                    fVar29 = stbtt__position_trapezoid_area
                                       (fVar27 - fVar31,fVar33,fVar33 + 1.0,bx0,fVar33 + 1.0);
                    uVar4 = (ulong)iVar15;
                    scanline[uVar4] = fVar29 * fVar34 + (float)local_2b8._0_4_ + scanline[uVar4];
                    fVar34 = (fVar27 - fVar35) * fVar34;
                  }
                  local_260[uVar4] = fVar34 + local_260[uVar4];
                }
              }
              else if (fVar29 < fVar26) {
                if (0.0 <= fVar29) {
                  local_288 = ZEXT416((uint)fVar29);
                  stbtt__handle_clipped_edge
                            (scanline,(int)fVar29,psVar5,fVar29,fVar25,fVar29,fVar24);
                  iVar20 = (int)fVar29 + 1;
                  fVar29 = (float)local_288._0_4_;
                }
                else {
                  iVar20 = 0;
                }
                stbtt__handle_clipped_edge(local_298,iVar20,psVar5,fVar29,fVar25,fVar29,fVar24);
              }
              psVar5 = psVar5->next;
            } while (psVar5 != (stbtt__active_edge *)0x0);
          }
          psVar5 = (stbtt__active_edge *)local_2d0._0_8_;
          if (0 < local_268->w) {
            fVar25 = 0.0;
            lVar8 = 0;
            do {
              fVar25 = fVar25 + local_298[lVar8];
              iVar16 = (int)(ABS(scanline[lVar8] + fVar25) * 255.0 + 0.5);
              uVar7 = (uchar)iVar16;
              if (0xfe < iVar16) {
                uVar7 = 0xff;
              }
              local_268->pixels[lVar8 + (long)(int)local_240 * (long)local_268->stride] = uVar7;
              lVar8 = lVar8 + 1;
            } while (lVar8 < local_268->w);
          }
          for (; psVar5 != (stbtt__active_edge *)0x0; psVar5 = psVar5->next) {
            psVar5->fx = psVar5->fdx + psVar5->fx;
          }
          uVar4 = (ulong)(local_290 + 1);
          uVar13 = (int)local_240 + 1;
          uVar3 = (ulong)uVar13;
          psVar21 = local_268;
          puVar11 = local_2a8;
          psVar19 = local_248;
        } while ((int)uVar13 < local_268->h);
      }
      while (local_248 = psVar19, puVar11 != (undefined8 *)0x0) {
        puVar6 = (undefined8 *)*puVar11;
        free(puVar11);
        puVar11 = puVar6;
        psVar19 = local_248;
      }
      if (scanline != (float *)&local_238) {
        free(scanline);
      }
      free(psVar19);
      __ptr = local_2a0;
    }
    free(__ptr);
    free(points);
  }
  return;
}

Assistant:

STBTT_DEF void stbtt_Rasterize(stbtt__bitmap *result, float flatness_in_pixels, stbtt_vertex *vertices, int num_verts, float scale_x, float scale_y, float shift_x, float shift_y, int x_off, int y_off, int invert, void *userdata)
{
   float scale            = scale_x > scale_y ? scale_y : scale_x;
   int winding_count      = 0;
   int *winding_lengths   = NULL;
   stbtt__point *windings = stbtt_FlattenCurves(vertices, num_verts, flatness_in_pixels / scale, &winding_lengths, &winding_count, userdata);
   if (windings) {
      stbtt__rasterize(result, windings, winding_lengths, winding_count, scale_x, scale_y, shift_x, shift_y, x_off, y_off, invert, userdata);
      STBTT_free(winding_lengths, userdata);
      STBTT_free(windings, userdata);
   }
}